

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

int secp256k1_ec_pubkey_serialize
              (secp256k1_context *ctx,uchar *output,size_t *outputlen,secp256k1_pubkey *pubkey,
              uint flags)

{
  int iVar1;
  uint uVar2;
  long in_RCX;
  ulong *in_RDX;
  void *in_RSI;
  uint in_R8D;
  int ret;
  size_t len;
  secp256k1_ge Q;
  uint in_stack_ffffffffffffff68;
  secp256k1_callback *in_stack_ffffffffffffff70;
  secp256k1_ge *ge;
  secp256k1_context *in_stack_ffffffffffffff78;
  int local_4;
  
  local_4 = 0;
  if (in_RDX == (ulong *)0x0) {
    secp256k1_callback_call(in_stack_ffffffffffffff70,(char *)(ulong)in_stack_ffffffffffffff68);
    local_4 = 0;
  }
  else {
    uVar2 = 0x41;
    if ((in_R8D & 0x100) != 0) {
      uVar2 = 0x21;
    }
    if (*in_RDX < (ulong)uVar2) {
      secp256k1_callback_call(in_stack_ffffffffffffff70,(char *)(ulong)in_stack_ffffffffffffff68);
      local_4 = 0;
    }
    else {
      ge = (secp256k1_ge *)*in_RDX;
      *in_RDX = 0;
      if (in_RSI == (void *)0x0) {
        secp256k1_callback_call((secp256k1_callback *)ge,(char *)(ulong)in_stack_ffffffffffffff68);
        local_4 = 0;
      }
      else {
        memset(in_RSI,0,(size_t)ge);
        if (in_RCX == 0) {
          secp256k1_callback_call
                    ((secp256k1_callback *)ge,(char *)CONCAT44(local_4,in_stack_ffffffffffffff68));
          local_4 = 0;
        }
        else if ((in_R8D & 0xff) == 2) {
          iVar1 = secp256k1_pubkey_load
                            (in_stack_ffffffffffffff78,ge,
                             (secp256k1_pubkey *)CONCAT44(local_4,in_stack_ffffffffffffff68));
          if ((iVar1 != 0) &&
             (local_4 = secp256k1_eckey_pubkey_serialize
                                  ((secp256k1_ge *)in_stack_ffffffffffffff78,(uchar *)ge,
                                   (size_t *)CONCAT44(local_4,in_stack_ffffffffffffff68),0),
             local_4 != 0)) {
            *in_RDX = (ulong)ge;
          }
        }
        else {
          secp256k1_callback_call
                    ((secp256k1_callback *)ge,(char *)CONCAT44(local_4,in_stack_ffffffffffffff68));
          local_4 = 0;
        }
      }
    }
  }
  return local_4;
}

Assistant:

int secp256k1_ec_pubkey_serialize(const secp256k1_context* ctx, unsigned char *output, size_t *outputlen, const secp256k1_pubkey* pubkey, unsigned int flags) {
    secp256k1_ge Q;
    size_t len;
    int ret = 0;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(outputlen != NULL);
    ARG_CHECK(*outputlen >= ((flags & SECP256K1_FLAGS_BIT_COMPRESSION) ? 33u : 65u));
    len = *outputlen;
    *outputlen = 0;
    ARG_CHECK(output != NULL);
    memset(output, 0, len);
    ARG_CHECK(pubkey != NULL);
    ARG_CHECK((flags & SECP256K1_FLAGS_TYPE_MASK) == SECP256K1_FLAGS_TYPE_COMPRESSION);
    if (secp256k1_pubkey_load(ctx, &Q, pubkey)) {
        ret = secp256k1_eckey_pubkey_serialize(&Q, output, &len, flags & SECP256K1_FLAGS_BIT_COMPRESSION);
        if (ret) {
            *outputlen = len;
        }
    }
    return ret;
}